

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_GL.cpp
# Opt level: O2

void __thiscall
Diligent::SerializedShaderImpl::CreateShaderGL
          (SerializedShaderImpl *this,IReferenceCounters *pRefCounters,ShaderCreateInfo *ShaderCI,
          RENDER_DEVICE_TYPE DeviceType,IDataBlob **ppCompilerOutput)

{
  SerializationDeviceImpl *pSVar1;
  IThreadPool *pIVar2;
  _Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false> _Var3;
  _Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false> this_00;
  IMemoryAllocator *RawAllocator;
  AsyncInitializer *this_01;
  IReferenceCounters *pRefCounters_00;
  TaskImpl *this_02;
  SerializationDeviceImpl *pSVar4;
  pointer __p;
  RefCntAutoPtr<TaskImpl> local_68;
  ShaderCreateInfoWrapper *local_60;
  string msg;
  __uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
  local_38;
  
  if ((ppCompilerOutput != (IDataBlob **)0x0) && (*ppCompilerOutput != (IDataBlob *)0x0)) {
    ppCompilerOutput = (IDataBlob **)0x0;
  }
  pSVar1 = this->m_pDevice;
  pSVar4 = pSVar1;
  if ((this->m_Shaders)._M_elems[0]._M_t.
      super___uniq_ptr_impl<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
      ._M_t.
      super__Tuple_impl<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
      .super__Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false>._M_head_impl
      != (CompiledShader *)0x0) {
    FormatString<char[57]>
              (&msg,(char (*) [57])"Shader has already been initialized for this device type");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateShader",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Inc.hpp"
               ,0x6f);
    std::__cxx11::string::~string((string *)&msg);
    pSVar4 = this->m_pDevice;
  }
  this_00._M_head_impl = (CompiledShader *)::operator_new(0x120);
  (this_00._M_head_impl)->_vptr_CompiledShader = (_func_int **)&PTR__CompiledShaderGL_00a4f3e8;
  this_00._M_head_impl[1] = (CompiledShader)pSVar4;
  RawAllocator = GetRawAllocator();
  local_60 = (ShaderCreateInfoWrapper *)(this_00._M_head_impl + 2);
  ShaderCreateInfoWrapper::ShaderCreateInfoWrapper(local_60,ShaderCI,RawAllocator);
  ((CreateInfo *)(this_00._M_head_impl + 0x18))->DeviceInfo =
       &(pSVar1->super_RenderDeviceBase<Diligent::SerializationEngineImplTraits>).m_DeviceInfo;
  this_00._M_head_impl[0x19] =
       (CompiledShader)
       &(pSVar1->super_RenderDeviceBase<Diligent::SerializationEngineImplTraits>).m_AdapterInfo;
  this_00._M_head_impl[0x1a] = (CompiledShader)ppCompilerOutput;
  *(RENDER_DEVICE_TYPE *)(this_00._M_head_impl + 0x1b) = DeviceType;
  (((unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_> *)
   (this_00._M_head_impl + 0x1c))->_M_t).
  super___uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
  .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl = (AsyncInitializer *)0x0
  ;
  ((atomic<Diligent::SHADER_STATUS> *)(this_00._M_head_impl + 0x1d))->_M_i =
       SHADER_STATUS_UNINITIALIZED;
  (((String *)(this_00._M_head_impl + 0x1e))->_M_dataplus)._M_p =
       (pointer)(this_00._M_head_impl + 0x20);
  this_00._M_head_impl[0x1f] = (_func_int **)0x0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)(this_00._M_head_impl + 0x20))->_M_local_buf[0] = '\0';
  ((RefCntAutoPtr<Diligent::IShader> *)(this_00._M_head_impl + 0x22))->m_pObject = (IShader *)0x0;
  *(bool *)(this_00._M_head_impl + 0x23) = false;
  pIVar2 = (pSVar4->super_RenderDeviceBase<Diligent::SerializationEngineImplTraits>).
           m_pShaderCompilationThreadPool.m_pObject;
  LOCK();
  ((atomic<Diligent::SHADER_STATUS> *)(this_00._M_head_impl + 0x1d))->_M_i = SHADER_STATUS_COMPILING
  ;
  UNLOCK();
  if ((pIVar2 == (IThreadPool *)0x0) ||
     ((ShaderCI->CompileFlags & SHADER_COMPILE_FLAG_ASYNCHRONOUS) == SHADER_COMPILE_FLAG_NONE)) {
    anon_unknown_1::CompiledShaderGL::InitializeSource((CompiledShaderGL *)this_00._M_head_impl);
    anon_unknown_1::CompiledShaderGL::CreateGLShader((CompiledShaderGL *)this_00._M_head_impl);
  }
  else {
    this_01 = (AsyncInitializer *)::operator_new(0x18);
    pRefCounters_00 = (IReferenceCounters *)::operator_new(0x30);
    pRefCounters_00->_vptr_IReferenceCounters = (_func_int **)&PTR_AddStrongRef_00a4d978;
    *(undefined4 *)((long)&pRefCounters_00[5]._vptr_IReferenceCounters + 4) = 0;
    pRefCounters_00[1]._vptr_IReferenceCounters = (_func_int **)0x0;
    pRefCounters_00[2]._vptr_IReferenceCounters = (_func_int **)0x0;
    pRefCounters_00[3]._vptr_IReferenceCounters = (_func_int **)0x0;
    pRefCounters_00[4]._vptr_IReferenceCounters = (_func_int **)0x0;
    *(undefined1 *)&pRefCounters_00[5]._vptr_IReferenceCounters = 0;
    this_02 = (TaskImpl *)malloc(0x28);
    AsyncTaskBase::AsyncTaskBase((AsyncTaskBase *)this_02,pRefCounters_00,0.0);
    (this_02->super_AsyncTaskBase).super_ObjectBase<Diligent::IAsyncTask>.
    super_RefCountedObject<Diligent::IAsyncTask>.super_IAsyncTask.super_IObject._vptr_IObject =
         (_func_int **)&PTR_QueryInterface_00a4f448;
    (this_02->m_Handler).Handler.this = (SerializedPipelineStateImpl *)this_00._M_head_impl;
    if (*(int *)((long)&pRefCounters_00[5]._vptr_IReferenceCounters + 4) != 0) {
      FormatString<char[33]>(&msg,(char (*) [33])"Object has already been attached");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Attach",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x10d);
      std::__cxx11::string::~string((string *)&msg);
    }
    pRefCounters_00[1]._vptr_IReferenceCounters = (_func_int **)&PTR_DestroyObject_00a4f4e8;
    pRefCounters_00[2]._vptr_IReferenceCounters = (_func_int **)this_02;
    pRefCounters_00[3]._vptr_IReferenceCounters = (_func_int **)0x0;
    LOCK();
    *(undefined4 *)((long)&pRefCounters_00[5]._vptr_IReferenceCounters + 4) = 1;
    UNLOCK();
    local_68.m_pObject = this_02;
    RefCountedObject<Diligent::IAsyncTask>::AddRef
              ((RefCountedObject<Diligent::IAsyncTask> *)this_02);
    (*(pIVar2->super_IObject)._vptr_IObject[4])(pIVar2,this_02,0,0);
    local_68.m_pObject = (TaskImpl *)0x0;
    msg._M_dataplus._M_p = (pointer)this_02;
    RefCntAutoPtr<TaskImpl>::~RefCntAutoPtr(&local_68);
    AsyncInitializer::AsyncInitializer(this_01,(RefCntAutoPtr<Diligent::IAsyncTask> *)&msg);
    RefCntAutoPtr<Diligent::IAsyncTask>::Release((RefCntAutoPtr<Diligent::IAsyncTask> *)&msg);
    local_38._M_t.
    super__Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
    .super__Head_base<0UL,_Diligent::AsyncInitializer_*,_false>._M_head_impl =
         (tuple<Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>)
         (_Tuple_impl<0UL,_Diligent::AsyncInitializer_*,_std::default_delete<Diligent::AsyncInitializer>_>
          )0x0;
    std::
    __uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    reset((__uniq_ptr_impl<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
           *)(this_00._M_head_impl + 0x1c),this_01);
    std::unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
    ~unique_ptr((unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>
                 *)&local_38);
  }
  _Var3._M_head_impl =
       (this->m_Shaders)._M_elems[0]._M_t.
       super___uniq_ptr_impl<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
       ._M_t.
       super__Tuple_impl<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
       .super__Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false>._M_head_impl;
  (this->m_Shaders)._M_elems[0]._M_t.
  super___uniq_ptr_impl<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
  .super__Head_base<0UL,_Diligent::SerializedShaderImpl::CompiledShader_*,_false>._M_head_impl =
       this_00._M_head_impl;
  if (_Var3._M_head_impl != (CompiledShader *)0x0) {
    (*(_Var3._M_head_impl)->_vptr_CompiledShader[1])();
  }
  return;
}

Assistant:

void SerializedShaderImpl::CreateShaderGL(IReferenceCounters*     pRefCounters,
                                          const ShaderCreateInfo& ShaderCI,
                                          RENDER_DEVICE_TYPE      DeviceType,
                                          IDataBlob**             ppCompilerOutput) noexcept(false)
{
    const ShaderGLImpl::CreateInfo GLShaderCI{
        m_pDevice->GetDeviceInfo(),
        m_pDevice->GetAdapterInfo(),
        // Do not overwrite compiler output from other APIs.
        // TODO: collect all outputs.
        ppCompilerOutput == nullptr || *ppCompilerOutput == nullptr ? ppCompilerOutput : nullptr,
    };

    CreateShader<CompiledShaderGL>(DeviceType::OpenGL, pRefCounters, ShaderCI, GLShaderCI, m_pDevice, DeviceType);
}